

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UTimeZoneFormatTimeType icu_63::TimeZoneFormat::getTimeType(UTimeZoneNameType nameType)

{
  UTimeZoneFormatTimeType local_c;
  UTimeZoneNameType nameType_local;
  
  switch(nameType) {
  case UTZNM_LONG_STANDARD:
  case UTZNM_SHORT_STANDARD:
    local_c = UTZFMT_TIME_TYPE_STANDARD;
    break;
  default:
    local_c = UTZFMT_TIME_TYPE_UNKNOWN;
    break;
  case UTZNM_LONG_DAYLIGHT:
  case UTZNM_SHORT_DAYLIGHT:
    local_c = UTZFMT_TIME_TYPE_DAYLIGHT;
  }
  return local_c;
}

Assistant:

UTimeZoneFormatTimeType
TimeZoneFormat::getTimeType(UTimeZoneNameType nameType) {
    switch (nameType) {
    case UTZNM_LONG_STANDARD:
    case UTZNM_SHORT_STANDARD:
        return UTZFMT_TIME_TYPE_STANDARD;

    case UTZNM_LONG_DAYLIGHT:
    case UTZNM_SHORT_DAYLIGHT:
        return UTZFMT_TIME_TYPE_DAYLIGHT;

    default:
        return UTZFMT_TIME_TYPE_UNKNOWN;
    }
}